

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InstructionFolder::IsFoldableVectorType
          (InstructionFolder *this,Instruction *type_inst)

{
  bool bVar1;
  uint32_t id;
  DefUseManager *this_00;
  Instruction *type_inst_00;
  
  if (type_inst->opcode_ == OpTypeVector) {
    id = Instruction::GetSingleWordInOperand(type_inst,0);
    this_00 = IRContext::get_def_use_mgr(this->context_);
    type_inst_00 = analysis::DefUseManager::GetDef(this_00,id);
    if (type_inst_00 != (Instruction *)0x0) {
      bVar1 = IsFoldableScalarType((InstructionFolder *)this_00,type_inst_00);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool InstructionFolder::IsFoldableVectorType(Instruction* type_inst) const {
  // Support vectors with foldable components
  if (type_inst->opcode() == spv::Op::OpTypeVector) {
    uint32_t component_type_id = type_inst->GetSingleWordInOperand(0);
    Instruction* def_component_type =
        context_->get_def_use_mgr()->GetDef(component_type_id);
    return def_component_type != nullptr &&
           IsFoldableScalarType(def_component_type);
  }
  // Nothing else yet.
  return false;
}